

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZPardisoSolver.cpp
# Opt level: O1

void __thiscall TPZPardisoSolver<double>::Decompose(TPZPardisoSolver<double> *this)

{
  TPZMatrix<double> *mat;
  TPZMatrix<double> *pTVar1;
  TPZAutoPointer<TPZMatrix<double>_> local_20;
  
  local_20.fRef = (this->super_TPZMatrixSolver<double>).fContainer.fRef;
  LOCK();
  ((local_20.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_20.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if ((local_20.fRef)->fPointer == (TPZMatrix<double> *)0x0) {
    mat = (TPZMatrix<double> *)0x0;
  }
  else {
    mat = (TPZMatrix<double> *)
          __dynamic_cast((local_20.fRef)->fPointer,&TPZMatrix<double>::typeinfo,
                         &TPZSYsmpMatrix<double>::typeinfo,0);
  }
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_20);
  local_20.fRef = (this->super_TPZMatrixSolver<double>).fContainer.fRef;
  LOCK();
  ((local_20.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_20.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if ((local_20.fRef)->fPointer == (TPZMatrix<double> *)0x0) {
    pTVar1 = (TPZMatrix<double> *)0x0;
  }
  else {
    pTVar1 = (TPZMatrix<double> *)
             __dynamic_cast((local_20.fRef)->fPointer,&TPZMatrix<double>::typeinfo,
                            &TPZFYsmpMatrix<double>::typeinfo,0);
  }
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_20);
  if ((mat == (TPZMatrix<double> *)0x0) && (mat = pTVar1, pTVar1 == (TPZMatrix<double> *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZPardisoSolver<double>::Decompose() [TVar = double]",0x42);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "This solver is only compatible with sparse matrices.\nAborting...\n",0x41);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Solvers/TPZPardisoSolver.cpp"
               ,0x8c);
  }
  Decompose(this,mat);
  return;
}

Assistant:

void TPZPardisoSolver<TVar>::Decompose()
{
    auto *tmpSym =
        dynamic_cast<TPZSYsmpMatrix<TVar>*>(this->Matrix().operator->());
    auto *tmpNSym =
        dynamic_cast<TPZFYsmpMatrix<TVar>*>(this->Matrix().operator->());
    if(tmpSym){
        Decompose(tmpSym);
    }else if(tmpNSym){
        Decompose(tmpNSym);
    }else{
        PZError<<__PRETTY_FUNCTION__;
        PZError<<"This solver is only compatible with sparse matrices.\nAborting...\n";
        DebugStop();
    }
}